

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int dupedExprNodeSize(Expr *p,int flags)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = dupedExprStructSize(p,flags);
  uVar1 = uVar1 & 0xfff;
  if (((p->flags & 0x400) == 0) && ((p->u).zToken != (char *)0x0)) {
    iVar2 = sqlite3Strlen30((p->u).zToken);
    uVar1 = uVar1 + iVar2 + 1;
  }
  return uVar1 + 7 & 0xfffffff8;
}

Assistant:

static int dupedExprNodeSize(Expr *p, int flags){
  int nByte = dupedExprStructSize(p, flags) & 0xfff;
  if( !ExprHasProperty(p, EP_IntValue) && p->u.zToken ){
    nByte += sqlite3Strlen30(p->u.zToken)+1;
  }
  return ROUND8(nByte);
}